

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  pointer *pppaVar1;
  aiAnimation *paVar2;
  aiScene *paVar3;
  pointer ppaVar4;
  iterator iVar5;
  aiAnimation *paVar6;
  long *plVar7;
  aiNodeAnim **ppaVar8;
  ulong uVar9;
  aiAnimation **__dest;
  long *plVar10;
  char *pcVar11;
  pointer ppaVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer __src;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  bool bVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  animTargets;
  string channelName;
  unsigned_long *local_4d8;
  iterator iStack_4d0;
  unsigned_long *local_4c8;
  long *local_4b8;
  ulong local_4b0;
  long local_4a8;
  long lStack_4a0;
  long *local_498;
  ulong local_490;
  long local_488 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  aiScene *local_448;
  long *local_440;
  string local_438 [32];
  
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppaVar12 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_448 = pScene;
  if (ppaVar12 == ppaVar4) {
    pcVar11 = (char *)0x0;
  }
  else {
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      paVar2 = ppaVar4[(long)paVar13];
      if (paVar2->mNumChannels == 1) {
        local_4d8 = (unsigned_long *)0x0;
        iStack_4d0._M_current = (unsigned_long *)0x0;
        local_4c8 = (unsigned_long *)0x0;
        local_438[0]._M_dataplus._M_p = (pointer)paVar13;
        while( true ) {
          local_438[0]._M_dataplus._M_p = local_438[0]._M_dataplus._M_p + 1;
          ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((undefined1 *)
              ((long)(this->mAnims).
                     super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppaVar4 >> 3) <=
              local_438[0]._M_dataplus._M_p) break;
          paVar6 = ppaVar4[(long)local_438[0]._M_dataplus._M_p];
          if (paVar6->mNumChannels == 1) {
            if ((paVar6->mDuration == paVar2->mDuration) &&
               (!NAN(paVar6->mDuration) && !NAN(paVar2->mDuration))) {
              if ((paVar6->mTicksPerSecond == paVar2->mTicksPerSecond) &&
                 (!NAN(paVar6->mTicksPerSecond) && !NAN(paVar2->mTicksPerSecond))) {
                if (iStack_4d0._M_current == local_4c8) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_4d8,
                             iStack_4d0,(unsigned_long *)local_438);
                }
                else {
                  *iStack_4d0._M_current = (unsigned_long)local_438[0]._M_dataplus._M_p;
                  iStack_4d0._M_current = iStack_4d0._M_current + 1;
                }
              }
            }
          }
        }
        local_478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_478._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_478._M_impl.super__Rb_tree_header._M_header;
        local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_478._M_impl.super__Rb_tree_header._M_header._M_right =
             local_478._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_438,((*paVar2->mChannels)->mNodeName).data,
                   (allocator<char> *)&local_4b8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_478,local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        if (iStack_4d0._M_current == local_4d8) {
LAB_0042528d:
          if (local_4d8 != iStack_4d0._M_current) {
            paVar6 = (aiAnimation *)operator_new(0x448);
            (paVar6->mName).length = 0;
            (paVar6->mName).data[0] = '\0';
            memset((paVar6->mName).data + 1,0x1b,0x3ff);
            paVar6->mDuration = -1.0;
            paVar6->mTicksPerSecond = 0.0;
            paVar6->mNumChannels = 0;
            paVar6->mChannels = (aiNodeAnim **)0x0;
            paVar6->mNumMeshChannels = 0;
            paVar6->mMeshChannels = (aiMeshAnim **)0x0;
            paVar6->mNumMorphMeshChannels = 0;
            paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
            local_498 = local_488;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"combinedAnim_","")
            ;
            plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_498,local_490,0,'\x01');
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_4a8 = *plVar10;
              lStack_4a0 = plVar7[3];
              local_4b8 = &local_4a8;
            }
            else {
              local_4a8 = *plVar10;
              local_4b8 = (long *)*plVar7;
            }
            local_4b0 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            local_440 = local_4b8;
            sVar16 = local_4b0 & 0xffffffff;
            if ((local_4b0 & 0xfffffc00) != 0) {
              sVar16 = 0x3ff;
            }
            local_438[0]._M_dataplus._M_p._0_4_ = (ai_uint32)sVar16;
            memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_4b8,sVar16);
            *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar16 + 4) = 0;
            (paVar6->mName).length = (ai_uint32)sVar16;
            memcpy((paVar6->mName).data,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),sVar16);
            (paVar6->mName).data[sVar16] = '\0';
            if (local_440 != &local_4a8) {
              operator_delete(local_440,local_4a8 + 1);
            }
            if (local_498 != local_488) {
              operator_delete(local_498,local_488[0] + 1);
            }
            paVar6->mDuration = paVar2->mDuration;
            paVar6->mTicksPerSecond = paVar2->mTicksPerSecond;
            uVar14 = (int)((ulong)((long)iStack_4d0._M_current - (long)local_4d8) >> 3) + 1;
            paVar6->mNumChannels = uVar14;
            ppaVar8 = (aiNodeAnim **)operator_new__((ulong)uVar14 << 3);
            paVar6->mChannels = ppaVar8;
            *ppaVar8 = *paVar2->mChannels;
            *paVar2->mChannels = (aiNodeAnim *)0x0;
            if (paVar2 != (aiAnimation *)0x0) {
              aiAnimation::~aiAnimation(paVar2);
              operator_delete(paVar2,0x448);
            }
            (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start[(long)paVar13] = paVar6;
            if (iStack_4d0._M_current != local_4d8) {
              uVar15 = 0;
              do {
                paVar2 = (this->mAnims).
                         super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                         super__Vector_impl_data._M_start[local_4d8[uVar15]];
                paVar6->mChannels[uVar15 + 1] = *paVar2->mChannels;
                *paVar2->mChannels = (aiNodeAnim *)0x0;
                if (paVar2 != (aiAnimation *)0x0) {
                  aiAnimation::~aiAnimation(paVar2);
                  operator_delete(paVar2,0x448);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)((long)iStack_4d0._M_current - (long)local_4d8 >> 3));
            }
            if (local_4d8 != iStack_4d0._M_current) {
              do {
                ppaVar4 = (this->mAnims).
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
                ppaVar12 = (this->mAnims).
                           super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                __src = ppaVar4 + iStack_4d0._M_current[-1] + 1;
                if (__src != ppaVar12) {
                  memmove(ppaVar4 + iStack_4d0._M_current[-1],__src,(long)ppaVar12 - (long)__src);
                }
                pppaVar1 = &(this->mAnims).
                            super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppaVar1 = *pppaVar1 + -1;
                iStack_4d0._M_current = iStack_4d0._M_current + -1;
              } while (local_4d8 != iStack_4d0._M_current);
            }
          }
        }
        else {
          bVar17 = true;
          uVar15 = 0;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_438,
                       ((*(this->mAnims).
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                          super__Vector_impl_data._M_start[local_4d8[uVar15]]->mChannels)->mNodeName
                       ).data,(allocator<char> *)&local_4b8);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_478,local_438);
            if ((_Rb_tree_header *)iVar5._M_node == &local_478._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_478,local_438);
            }
            else {
              bVar17 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
          } while (((_Rb_tree_header *)iVar5._M_node == &local_478._M_impl.super__Rb_tree_header) &&
                  (uVar15 = uVar15 + 1,
                  uVar15 < (ulong)((long)iStack_4d0._M_current - (long)local_4d8 >> 3)));
          if (bVar17) goto LAB_0042528d;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_478);
        if (local_4d8 != (unsigned_long *)0x0) {
          operator_delete(local_4d8,(long)local_4c8 - (long)local_4d8);
        }
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar13->_M_local_buf + 1);
      ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppaVar12 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pcVar11 = (char *)((long)ppaVar12 - (long)ppaVar4 >> 3);
    } while (paVar13 < pcVar11);
  }
  paVar3 = local_448;
  if (ppaVar4 != ppaVar12) {
    local_448->mNumAnimations = (uint)pcVar11;
    uVar9 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0xffffffffffffffff;
    if (-1 < (long)uVar9) {
      uVar15 = uVar9;
    }
    __dest = (aiAnimation **)operator_new__(uVar15);
    paVar3->mAnimations = __dest;
    ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar16 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar4;
    if (sVar16 != 0) {
      memmove(__dest,ppaVar4,sVar16);
    }
  }
  ppaVar4 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar4) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar4;
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for(size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];

        if (templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
						collectedAnimIndices.push_back(b);
            }

			// We only want to combine the animations if they have different channels
			std::set<std::string> animTargets;
			animTargets.insert(templateAnim->mChannels[0]->mNodeName.C_Str());
			bool collectedAnimationsHaveDifferentChannels = true;
			for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
			{
				aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
				std::string channelName = std::string(srcAnimation->mChannels[0]->mNodeName.C_Str());
				if (animTargets.find(channelName) == animTargets.end()) {
					animTargets.insert(channelName);
				} else {
					collectedAnimationsHaveDifferentChannels = false;
					break;
				}
			}

			if (!collectedAnimationsHaveDifferentChannels)
				continue;

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}